

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_thread_create(ma_context *pContext,ma_thread *pThread,ma_thread_entry_proc entryProc,
                          void *pData)

{
  ma_thread_priority mVar1;
  int iVar2;
  uint __algorithm;
  int iVar3;
  int iVar4;
  ma_result mVar5;
  pthread_attr_t *ppVar6;
  int local_7c;
  void *local_78;
  int local_6c;
  pthread_attr_t attr;
  
  if (entryProc == (ma_thread_entry_proc)0x0 ||
      (pThread == (ma_thread *)0x0 || pContext == (ma_context *)0x0)) {
    return 0;
  }
  pThread->pContext = pContext;
  iVar2 = (*(pContext->field_22).posix.pthread_attr_init)();
  mVar5 = 0;
  if (iVar2 != 0) {
    ppVar6 = (pthread_attr_t *)0x0;
    goto LAB_00105525;
  }
  local_78 = pData;
  if (pContext->threadPriority == ma_thread_priority_realtime) {
    __algorithm = 1;
LAB_001054bf:
    iVar2 = (*(pContext->field_22).posix.pthread_attr_setschedpolicy)(&attr,(ulong)__algorithm);
    if (iVar2 == 0) {
LAB_001054df:
      iVar2 = sched_get_priority_min(__algorithm);
      iVar3 = sched_get_priority_max(__algorithm);
      local_6c = (iVar3 - iVar2) / 7;
      iVar4 = (*(pContext->field_22).posix.pthread_attr_getschedparam)
                        (&attr,&local_7c,(long)(iVar3 - iVar2) % 7 & 0xffffffff);
      if (iVar4 == 0) {
        mVar1 = pContext->threadPriority;
        iVar4 = iVar3;
        if ((mVar1 != ma_thread_priority_realtime) &&
           (iVar4 = iVar2, mVar1 != ma_thread_priority_idle)) {
          iVar4 = (mVar1 + 5) * local_6c + local_7c;
          if (iVar4 <= iVar2) {
            iVar4 = iVar2;
          }
          if (iVar3 <= iVar4) {
            iVar4 = iVar3;
          }
        }
        local_7c = iVar4;
        iVar2 = (*(pContext->field_22).posix.pthread_attr_setschedparam)(&attr,&local_7c);
        ppVar6 = (pthread_attr_t *)0x0;
        if (iVar2 == 0) {
          ppVar6 = &attr;
        }
        goto LAB_00105514;
      }
    }
    ppVar6 = (pthread_attr_t *)0x0;
  }
  else {
    if (pContext->threadPriority == ma_thread_priority_idle) {
      __algorithm = 5;
      goto LAB_001054bf;
    }
    __algorithm = sched_getscheduler(0);
    ppVar6 = (pthread_attr_t *)0x0;
    if (__algorithm != 0xffffffff) goto LAB_001054df;
  }
LAB_00105514:
  pData = local_78;
  (*(pContext->field_22).posix.pthread_attr_destroy)(&attr);
LAB_00105525:
  iVar2 = (*(pContext->field_22).posix.pthread_create)(&pThread->field_1,ppVar6,entryProc,pData);
  if (iVar2 != 0) {
    mVar5 = ma_result_from_errno(iVar2);
  }
  return mVar5;
}

Assistant:

static ma_result ma_thread_create(ma_context* pContext, ma_thread* pThread, ma_thread_entry_proc entryProc, void* pData)
{
    if (pContext == NULL || pThread == NULL || entryProc == NULL) {
        return MA_FALSE;
    }

    pThread->pContext = pContext;

#ifdef MA_WIN32
    return ma_thread_create__win32(pContext, pThread, entryProc, pData);
#endif
#ifdef MA_POSIX
    return ma_thread_create__posix(pContext, pThread, entryProc, pData);
#endif
}